

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_124f03::build
          (anon_unknown_dwarf_124f03 *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *cmap,string *bos)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 uVar2;
  undefined1 extraout_AL;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_color _Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  
  p_Var3 = *(_Rb_tree_node_base **)(this + 0x18);
  if (p_Var3 != (_Rb_tree_node_base *)(this + 8)) {
    _Var4 = _S_black;
    do {
      p_Var3[2]._M_color = _Var4;
      _Var4 = _Var4 + _S_black;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)(this + 8));
  }
  paVar1 = &local_58.first.field_2;
  local_58.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,cmap,(long)&(bos->_M_dataplus)._M_p + (long)&(cmap->_M_t)._M_impl);
  local_58.second = 0;
  pVar5 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                      *)this,&local_58);
  uVar2 = pVar5.first._M_node._0_1_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.first._M_dataplus._M_p);
    uVar2 = extraout_AL;
  }
  return (bool)uVar2;
}

Assistant:

bool build(std::map<std::string, int> *cmap,
           const std::string &bos) {
  int id = 1;  // for BOS/EOS
  for (std::map<std::string, int>::iterator it = cmap->begin();
       it != cmap->end();
       ++it) it->second = id++;
  cmap->insert(std::make_pair(bos, 0));
  return true;
}